

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall
QDockAreaLayout::addDockWidget
          (QDockAreaLayout *this,DockPosition pos,QDockWidget *dockWidget,Orientation orientation)

{
  bool bVar1;
  int iVar2;
  QLayoutItem *this_00;
  undefined4 extraout_var;
  QDockAreaLayoutInfo *this_01;
  QDockAreaLayoutInfo *this_02;
  long in_FS_OFFSET;
  QDockAreaLayoutItem local_d0;
  QDockAreaLayoutInfo local_a8;
  long local_38;
  quintptr id;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QLayoutItem *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_00,dockWidget);
  this_02 = this->docks + pos;
  if ((this->docks[pos].o == orientation) || ((ulong)this->docks[pos].item_list.d.size < 2)) {
    this->docks[pos].o = orientation;
    local_a8.separatorWidgets.d.d = (Data *)0x0;
    local_a8.separatorWidgets.d.ptr = (QWidget **)0x0;
    local_a8.separatorWidgets.d.size = -0x100000000;
    local_a8.dockPos = LeftDock;
    local_a8.o = 0xaaaaaaaa;
    local_a8.sep = (int *)this_00;
    QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem_const&>
              (&this->docks[pos].item_list,(QDockAreaLayoutItem *)&local_a8);
    if (this->docks[pos].tabbed == true) {
      bVar1 = QDockAreaLayoutItem::skip((QDockAreaLayoutItem *)&local_a8);
      if (!bVar1) {
        QDockAreaLayoutInfo::updateTabBar(this_02);
        if ((QLayoutItem *)local_a8.sep == (QLayoutItem *)0x0) {
          id = 0;
        }
        else {
          iVar2 = (*(((QWidgetItem *)local_a8.sep)->super_QLayoutItem)._vptr_QLayoutItem[0xd])();
          id = CONCAT44(extraout_var,iVar2);
        }
        QDockAreaLayoutInfo::setCurrentTabId(this_02,id);
      }
    }
    QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)&local_a8);
  }
  else {
    local_a8._89_7_ = 0xaaaaaaaaaaaaaa;
    local_a8.sep = &this->sep;
    local_a8.mainWindow = this->mainWindow;
    local_a8.separatorWidgets.d.d = (Data *)0x0;
    local_a8.separatorWidgets.d.ptr = (QWidget **)0x0;
    local_a8.separatorWidgets.d.size = 0;
    local_a8.o = orientation;
    local_a8.dockPos = pos;
    local_a8.rect.x1.m_i = 0;
    local_a8.rect.y1.m_i = 0;
    local_a8.rect.x2.m_i = -1;
    local_a8.rect.y2.m_i = -1;
    local_a8.tabBar = (QTabBar *)0x0;
    local_a8.item_list.d.d = (Data *)0x0;
    local_a8.item_list.d.ptr._0_1_ = 0;
    local_a8.item_list.d.ptr._1_7_ = 0;
    local_a8.item_list.d.size._0_1_ = 0;
    local_a8.item_list.d.size._1_7_ = 0;
    local_a8.tabbed = false;
    local_a8._108_4_ = 0xaaaaaaaa;
    local_a8.tabBarShape = this->docks[pos].tabBarShape;
    this_01 = (QDockAreaLayoutInfo *)operator_new(0x70);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo(this_01,this_02);
    local_d0.widgetItem = (QLayoutItem *)0x0;
    local_d0.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_d0.pos = 0;
    local_d0.size = -1;
    local_d0.flags = 0;
    local_d0.subinfo = this_01;
    QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem>(&local_a8.item_list,&local_d0);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_d0);
    local_d0.pos = 0;
    local_d0.subinfo = (QDockAreaLayoutInfo *)0x0;
    local_d0.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_d0.size = -1;
    local_d0.flags = 0;
    local_d0.widgetItem = this_00;
    QList<QDockAreaLayoutItem>::emplaceBack<QDockAreaLayoutItem>(&local_a8.item_list,&local_d0);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_d0);
    QDockAreaLayoutInfo::operator=(this_02,&local_a8);
    QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&local_a8);
  }
  QObject::objectName();
  removePlaceHolder(this,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::addDockWidget(QInternal::DockPosition pos, QDockWidget *dockWidget,
                                             Qt::Orientation orientation)
{
    QLayoutItem *dockWidgetItem = new QDockWidgetItem(dockWidget);
    QDockAreaLayoutInfo &info = docks[pos];
    if (orientation == info.o || info.item_list.size() <= 1) {
        // empty dock areas, or dock areas containing exactly one widget can have their orientation
        // switched.
        info.o = orientation;

        QDockAreaLayoutItem new_item(dockWidgetItem);
        info.item_list.append(new_item);
#if QT_CONFIG(tabbar)
        if (info.tabbed && !new_item.skip()) {
            info.updateTabBar();
            info.setCurrentTabId(tabId(new_item));
        }
#endif
    } else {
#if QT_CONFIG(tabbar)
        int tbshape = info.tabBarShape;
#else
        int tbshape = 0;
#endif
        QDockAreaLayoutInfo new_info(&sep, pos, orientation, tbshape, mainWindow);
        new_info.item_list.append(QDockAreaLayoutItem(new QDockAreaLayoutInfo(info)));
        new_info.item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        info = new_info;
    }

    removePlaceHolder(dockWidget->objectName());
}